

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int WebRtcIsac_EncodeUb12
              (TransformTables *transform_tables,float *in,ISACUBEncStruct *ISACencUB_obj,
              int32_t jitterInfo)

{
  uint32_t uVar1;
  double signal_noise_ratio;
  int16_t iVar2;
  ushort payloadLimitBytes;
  int status;
  long lVar3;
  double *interpolLPCCoeff;
  double varscale [1];
  transcode_obj local_2c38;
  double lpcGains [6];
  double lpcVecs [8];
  double percepFilterParams [30];
  double corr [6] [5];
  int16_t fim [240];
  int16_t fre [240];
  float LP [240];
  float HP [240];
  double HPw [240];
  double LPw [240];
  double HP_lookahead [240];
  double LP_lookahead [240];
  
  memcpy(ISACencUB_obj->data_buffer_float + ISACencUB_obj->buffer_index,in,0x280);
  if (ISACencUB_obj->buffer_index < 0x140) {
    ISACencUB_obj->buffer_index = ISACencUB_obj->buffer_index + 0xa0;
    status = 0;
  }
  else {
    ISACencUB_obj->buffer_index = 0;
    (ISACencUB_obj->bitstr_obj).W_upper = 0xffffffff;
    (ISACencUB_obj->bitstr_obj).streamval = 0;
    (ISACencUB_obj->bitstr_obj).stream_index = 0;
    WebRtcIsac_EncodeJitterInfo(jitterInfo,&ISACencUB_obj->bitstr_obj);
    iVar2 = WebRtcIsac_EncodeBandwidth(isac12kHz,&ISACencUB_obj->bitstr_obj);
    if (iVar2 < 0) {
      status = (int)iVar2;
    }
    else {
      signal_noise_ratio = WebRtcIsac_GetSnr(ISACencUB_obj->bottleneck,0x1e0);
      WebRtcIsac_SplitAndFilterFloat
                (ISACencUB_obj->data_buffer_float,HP,LP,HP_lookahead,LP_lookahead,
                 &ISACencUB_obj->prefiltbankstr_obj);
      WebRtcIsac_GetLpcCoefUb
                (LP_lookahead,&ISACencUB_obj->maskfiltstr_obj,lpcVecs,corr,varscale,0xc);
      interpolLPCCoeff = percepFilterParams;
      WebRtcIsac_EncodeLpcUB
                (lpcVecs,&ISACencUB_obj->bitstr_obj,interpolLPCCoeff,0xc,&ISACencUB_obj->SaveEnc_obj
                );
      WebRtcIsac_GetLpcGain(signal_noise_ratio,interpolLPCCoeff,6,lpcGains,corr,varscale);
      local_2c38.stream_index = (ISACencUB_obj->bitstr_obj).stream_index;
      local_2c38.W_upper = (ISACencUB_obj->bitstr_obj).W_upper;
      local_2c38.streamval = (ISACencUB_obj->bitstr_obj).streamval;
      local_2c38.stream[0] = (ISACencUB_obj->bitstr_obj).stream[local_2c38.stream_index - 2];
      local_2c38.stream[1] = (ISACencUB_obj->bitstr_obj).stream[local_2c38.stream_index - 1];
      local_2c38.stream[2] = (ISACencUB_obj->bitstr_obj).stream[local_2c38.stream_index];
      local_2c38.loFiltGain[0] = lpcGains[0];
      local_2c38.loFiltGain[1] = lpcGains[1];
      local_2c38.loFiltGain[2] = lpcGains[2];
      local_2c38.loFiltGain[3] = lpcGains[3];
      local_2c38.loFiltGain[4] = lpcGains[4];
      local_2c38.loFiltGain[5] = lpcGains[5];
      (ISACencUB_obj->SaveEnc_obj).lpcGain[4] = lpcGains[4];
      (ISACencUB_obj->SaveEnc_obj).lpcGain[5] = lpcGains[5];
      (ISACencUB_obj->SaveEnc_obj).lpcGain[2] = lpcGains[2];
      (ISACencUB_obj->SaveEnc_obj).lpcGain[3] = lpcGains[3];
      (ISACencUB_obj->SaveEnc_obj).lpcGain[0] = lpcGains[0];
      (ISACencUB_obj->SaveEnc_obj).lpcGain[1] = lpcGains[1];
      WebRtcIsac_EncodeLpcGainUb
                (lpcGains,&ISACencUB_obj->bitstr_obj,(ISACencUB_obj->SaveEnc_obj).lpcGainIndex);
      lVar3 = 0;
      do {
        *interpolLPCCoeff = lpcGains[lVar3];
        lVar3 = lVar3 + 1;
        interpolLPCCoeff = interpolLPCCoeff + 5;
      } while (lVar3 != 6);
      WebRtcIsac_NormLatticeFilterMa
                (4,(ISACencUB_obj->maskfiltstr_obj).PreStateLoF,
                 (ISACencUB_obj->maskfiltstr_obj).PreStateLoG,LP,percepFilterParams,LPw);
      payloadLimitBytes = (ISACencUB_obj->maxPayloadSizeBytes - ISACencUB_obj->numBytesUsed) - 3;
      uVar1 = (ISACencUB_obj->bitstr_obj).stream_index;
      memset(HPw,0,0x780);
      WebRtcIsac_Time2Spec(transform_tables,LPw,HPw,fre,fim,&ISACencUB_obj->fftstr_obj);
      memcpy((ISACencUB_obj->SaveEnc_obj).realFFT,fre,0x1e0);
      memcpy((ISACencUB_obj->SaveEnc_obj).imagFFT,fim,0x1e0);
      memcpy(&(ISACencUB_obj->SaveEnc_obj).bitStreamObj,ISACencUB_obj,0x264);
      status = WebRtcIsac_EncodeSpec(fre,fim,0,kIsacUpperBand12,&ISACencUB_obj->bitstr_obj);
      if (-1 < status || status == -0x1928) {
        if ((status == -0x1928) ||
           ((uint)payloadLimitBytes < (ISACencUB_obj->bitstr_obj).stream_index)) {
          status = LimitPayloadUb(ISACencUB_obj,payloadLimitBytes,
                                  (double)(payloadLimitBytes - uVar1),&local_2c38,fre,fim,lpcGains,
                                  kIsacUpperBand12,status);
        }
        if (-1 < status) {
          status = WebRtcIsac_EncTerminate(&ISACencUB_obj->bitstr_obj);
        }
      }
    }
  }
  return status;
}

Assistant:

int WebRtcIsac_EncodeUb12(const TransformTables* transform_tables,
                          float* in, ISACUBEncStruct* ISACencUB_obj,
                          int32_t jitterInfo) {
  int err;
  int k;

  double lpcVecs[UB_LPC_ORDER * UB_LPC_VEC_PER_FRAME];

  double percepFilterParams[(1 + UB_LPC_ORDER) * SUBFRAMES];
  float LP[FRAMESAMPLES_HALF];
  float HP[FRAMESAMPLES_HALF];

  double LP_lookahead[FRAMESAMPLES_HALF];
  double HP_lookahead[FRAMESAMPLES_HALF];
  double LPw[FRAMESAMPLES_HALF];

  double HPw[FRAMESAMPLES_HALF];
  int16_t fre[FRAMESAMPLES_HALF];   /* Q7 */
  int16_t fim[FRAMESAMPLES_HALF];   /* Q7 */

  int status = 0;

  double varscale[1];

  double corr[UB_LPC_GAIN_DIM][UB_LPC_ORDER + 1];
  double lpcGains[SUBFRAMES];
  transcode_obj transcodingParam;
  uint16_t payloadLimitBytes;
  double s2nr;
  const int16_t kAveragePitchGain = 0.0;
  double bytesLeftSpecCoding;

  /* Buffer speech samples (by 10ms packet) until the framelength is  */
  /* reached (30 ms).                                                 */
  /********************************************************************/

  /* Fill the buffer with 10ms input data. */
  memcpy(&ISACencUB_obj->data_buffer_float[ISACencUB_obj->buffer_index], in,
         FRAMESAMPLES_10ms * sizeof(float));

  /* if buffer-size is not equal to current frame-size then increase the
     index and return. We do the encoding when we have enough audio.     */
  if (ISACencUB_obj->buffer_index + FRAMESAMPLES_10ms < FRAMESAMPLES) {
    ISACencUB_obj->buffer_index += FRAMESAMPLES_10ms;
    return 0;
  }
  /* If buffer reached the right size, reset index and continue
     with encoding the frame */
  ISACencUB_obj->buffer_index = 0;

  /* End of buffer function */
  /**************************/

  /* Encoding */
  /************/

  /* Reset bit-stream. */
  WebRtcIsac_ResetBitstream(&(ISACencUB_obj->bitstr_obj));

  /* Encoding bandwidth information. */
  WebRtcIsac_EncodeJitterInfo(jitterInfo, &ISACencUB_obj->bitstr_obj);
  status = WebRtcIsac_EncodeBandwidth(isac12kHz, &ISACencUB_obj->bitstr_obj);
  if (status < 0) {
    return status;
  }

  s2nr = WebRtcIsac_GetSnr(ISACencUB_obj->bottleneck, FRAMESAMPLES);

  /* Split signal in two bands. */
  WebRtcIsac_SplitAndFilterFloat(ISACencUB_obj->data_buffer_float, HP, LP,
                                 HP_lookahead, LP_lookahead,
                                 &ISACencUB_obj->prefiltbankstr_obj);

  /* Find coefficients for perceptual pre-filters. */
  WebRtcIsac_GetLpcCoefUb(LP_lookahead, &ISACencUB_obj->maskfiltstr_obj,
                          lpcVecs, corr, varscale, isac12kHz);

  /* Code LPC model and shape - gains not quantized yet. */
  WebRtcIsac_EncodeLpcUB(lpcVecs, &ISACencUB_obj->bitstr_obj,
                         percepFilterParams, isac12kHz,
                         &ISACencUB_obj->SaveEnc_obj);

  WebRtcIsac_GetLpcGain(s2nr, percepFilterParams, SUBFRAMES, lpcGains, corr,
                        varscale);

  /* Store the state of arithmetic coder before coding LPC gains. */
  transcodingParam.W_upper = ISACencUB_obj->bitstr_obj.W_upper;
  transcodingParam.stream_index = ISACencUB_obj->bitstr_obj.stream_index;
  transcodingParam.streamval = ISACencUB_obj->bitstr_obj.streamval;
  transcodingParam.stream[0] =
      ISACencUB_obj->bitstr_obj.stream[ISACencUB_obj->bitstr_obj.stream_index -
                                       2];
  transcodingParam.stream[1] =
      ISACencUB_obj->bitstr_obj.stream[ISACencUB_obj->bitstr_obj.stream_index -
                                       1];
  transcodingParam.stream[2] =
      ISACencUB_obj->bitstr_obj.stream[ISACencUB_obj->bitstr_obj.stream_index];

  /* Store LPC Gains before encoding them. */
  for (k = 0; k < SUBFRAMES; k++) {
    transcodingParam.loFiltGain[k] = lpcGains[k];
  }

  /* Store the gains for multiple encoding. */
  memcpy(ISACencUB_obj->SaveEnc_obj.lpcGain, lpcGains, SUBFRAMES *
         sizeof(double));

  WebRtcIsac_EncodeLpcGainUb(lpcGains, &ISACencUB_obj->bitstr_obj,
                             ISACencUB_obj->SaveEnc_obj.lpcGainIndex);

  for (k = 0; k < SUBFRAMES; k++) {
    percepFilterParams[k * (UB_LPC_ORDER + 1)] = lpcGains[k];
  }

  /* perceptual pre-filtering (using normalized lattice filter) */
  /* low-band filtering */
  WebRtcIsac_NormLatticeFilterMa(UB_LPC_ORDER,
                                 ISACencUB_obj->maskfiltstr_obj.PreStateLoF,
                                 ISACencUB_obj->maskfiltstr_obj.PreStateLoG, LP,
                                 percepFilterParams, LPw);

  /* Get the correct value for the payload limit and calculate the number
     of bytes left for coding the spectrum. It is a 30ms frame Subract 3
     because termination process may add 3 bytes */
  payloadLimitBytes = ISACencUB_obj->maxPayloadSizeBytes -
      ISACencUB_obj->numBytesUsed - 3;
  bytesLeftSpecCoding = payloadLimitBytes -
      ISACencUB_obj->bitstr_obj.stream_index;

  memset(HPw, 0, sizeof(HPw));

  /* Transform */
  WebRtcIsac_Time2Spec(transform_tables,
                       LPw, HPw, fre, fim, &ISACencUB_obj->fftstr_obj);

  /* Store FFT coefficients for multiple encoding. */
  memcpy(ISACencUB_obj->SaveEnc_obj.realFFT, fre,
         sizeof(ISACencUB_obj->SaveEnc_obj.realFFT));
  memcpy(ISACencUB_obj->SaveEnc_obj.imagFFT, fim,
         sizeof(ISACencUB_obj->SaveEnc_obj.imagFFT));

  /* Save the bit-stream object at this point for FEC. */
  memcpy(&ISACencUB_obj->SaveEnc_obj.bitStreamObj,
         &ISACencUB_obj->bitstr_obj, sizeof(Bitstr));

  /* Quantization and loss-less coding */
  /* The 4th parameter to this function is pitch-gain, which is only used
   * when encoding 0-8 kHz band, and irrelevant in this function, therefore,
   * we insert zero here. */
  err = WebRtcIsac_EncodeSpec(fre, fim, kAveragePitchGain, kIsacUpperBand12,
                              &ISACencUB_obj->bitstr_obj);
  if ((err < 0) && (err != -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
    /* There has been an error but it was not too large
       payload (we can cure too large payload) */
    return err;
  }

  if ((ISACencUB_obj->bitstr_obj.stream_index > payloadLimitBytes) ||
      (err == -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
    err = LimitPayloadUb(ISACencUB_obj, payloadLimitBytes, bytesLeftSpecCoding,
                         &transcodingParam, fre, fim, lpcGains,
                         kIsacUpperBand12, err);
  }
  if (err < 0) {
    return err;
  }
  /* Complete arithmetic coding. */
  return WebRtcIsac_EncTerminate(&ISACencUB_obj->bitstr_obj);
}